

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAnimatedMeshSceneNode.cpp
# Opt level: O2

void __thiscall
irr::scene::CAnimatedMeshSceneNode::~CAnimatedMeshSceneNode(CAnimatedMeshSceneNode *this,void **vtt)

{
  void *pvVar1;
  IAnimationEndCallBack *pIVar2;
  IAnimatedMesh *pIVar3;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[5];
  pIVar2 = this->LoopCallBack;
  if (pIVar2 != (IAnimationEndCallBack *)0x0) {
    IReferenceCounted::drop((IReferenceCounted *)(pIVar2 + *(long *)(*(long *)pIVar2 + -0x18)));
  }
  pIVar3 = this->Mesh;
  if (pIVar3 != (IAnimatedMesh *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&(pIVar3->super_IMesh)._vptr_IMesh +
               (long)(pIVar3->super_IMesh)._vptr_IMesh[-3]));
  }
  ::std::_Vector_base<irr::core::CMatrix4<float>,_std::allocator<irr::core::CMatrix4<float>_>_>::
  ~_Vector_base((_Vector_base<irr::core::CMatrix4<float>,_std::allocator<irr::core::CMatrix4<float>_>_>
                 *)&this->PretransitingSave);
  ::std::_Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>::
  ~_Vector_base((_Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                 *)&this->JointChildSceneNodes);
  ::std::vector<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>::~vector
            (&(this->Materials).m_data);
  ISceneNode::~ISceneNode((ISceneNode *)this,vtt + 2);
  return;
}

Assistant:

CAnimatedMeshSceneNode::~CAnimatedMeshSceneNode()
{
	if (LoopCallBack)
		LoopCallBack->drop();
	if (Mesh)
		Mesh->drop();
}